

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise.cpp
# Opt level: O2

int __thiscall
ncnn::DeconvolutionDepthWise::forward
          (DeconvolutionDepthWise *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int kernel_w;
  int kernel_h;
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  pointer pMVar8;
  int *piVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  DeconvolutionDepthWise *this_00;
  int iVar12;
  int iVar13;
  Allocator **ppAVar14;
  uint uVar15;
  int _c;
  void *pvVar16;
  void *pvVar17;
  int k;
  ulong uVar18;
  ulong uVar19;
  void *pvVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  int i;
  ulong uVar26;
  void *pvVar27;
  ulong uVar28;
  uint uVar29;
  ulong uVar30;
  undefined1 auVar31 [16];
  Mat local_198;
  Allocator **local_148;
  pointer local_140;
  DeconvolutionDepthWise *local_138;
  pointer local_130;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_128;
  void *local_120;
  undefined1 local_118 [32];
  Allocator *local_f8;
  int iStack_f0;
  int iStack_ec;
  undefined8 uStack_e8;
  int local_e0;
  size_t local_d8;
  Mat local_c8;
  Mat local_78;
  
  local_130 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
  pMVar8 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar12 = local_130->c;
  kernel_w = local_130[1].w;
  kernel_h = local_130[1].h;
  _c = this->group * local_130[1].d;
  local_78.cstep = 0;
  local_78.data = (void *)0x0;
  local_78.refcount._0_4_ = 0;
  local_78.refcount._4_4_ = 0;
  local_78.elemsize._0_4_ = 0;
  local_78._20_8_ = 0;
  local_78.allocator = (Allocator *)0x0;
  local_78.dims = 0;
  local_78.w = 0;
  local_78.h = 0;
  local_78.d = 0;
  local_78.c = 0;
  local_128 = bottom_blobs;
  flatten(local_130 + 1,&local_78,opt);
  iVar22 = -100;
  if ((local_78.data == (void *)0x0) || ((long)local_78.c * local_78.cstep == 0)) goto LAB_003e0276;
  local_c8.cstep = 0;
  uVar29 = kernel_h * kernel_w;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8._20_8_ = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  local_140 = pMVar8;
  local_138 = this;
  Mat::create(&local_c8,(int)(uVar29 * iVar12 * _c) / this->group,4,opt->workspace_allocator);
  this_00 = local_138;
  pMVar8 = local_140;
  iVar22 = -100;
  if ((local_c8.data != (void *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
    local_148 = &opt->workspace_allocator;
    uVar1 = local_138->group;
    uVar15 = _c / (int)uVar1;
    uVar28 = (long)iVar12 / (long)(int)uVar1;
    local_120 = local_78.data;
    uVar26 = 0;
    uVar23 = 0;
    if (0 < (int)uVar29) {
      uVar23 = (ulong)uVar29;
    }
    lVar24 = (long)(int)uVar29;
    iVar12 = (int)uVar28;
    uVar25 = 0;
    if (0 < iVar12) {
      uVar25 = uVar28 & 0xffffffff;
    }
    uVar28 = 0;
    if (0 < (int)uVar15) {
      uVar28 = (ulong)uVar15;
    }
    uVar19 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar19 = uVar26;
    }
    for (uVar30 = 0; uVar30 != uVar19; uVar30 = uVar30 + 1) {
      iVar22 = (int)uVar26;
      pvVar16 = (void *)((long)local_c8.data + (long)iVar22 * 4);
      pvVar20 = (void *)((long)local_78.data + (long)iVar22 * 4);
      for (uVar26 = 0; uVar26 != uVar28; uVar26 = uVar26 + 1) {
        pvVar17 = pvVar20;
        pvVar27 = pvVar16;
        for (uVar21 = 0; uVar21 != uVar25; uVar21 = uVar21 + 1) {
          for (uVar18 = 0; uVar23 != uVar18; uVar18 = uVar18 + 1) {
            *(undefined4 *)((long)pvVar27 + uVar18 * 4) =
                 *(undefined4 *)((long)pvVar17 + uVar18 * 4);
          }
          pvVar27 = (void *)((long)pvVar27 + lVar24 * 4);
          pvVar17 = (void *)((long)pvVar17 + (int)uVar15 * lVar24 * 4);
        }
        pvVar16 = (void *)((long)pvVar16 + iVar12 * lVar24 * 4);
        pvVar20 = (void *)((long)pvVar20 + lVar24 * 4);
      }
      uVar26 = (ulong)(iVar22 + iVar12 * uVar29 * uVar15);
    }
    local_d8 = 0;
    local_118._0_8_ = (void *)0x0;
    local_118._8_4_ = 0;
    local_118._12_4_ = 0;
    local_118._16_12_ = SUB1612((undefined1  [16])0x0,4);
    local_f8 = (Allocator *)0x0;
    iStack_f0 = 0;
    iStack_ec = 0;
    uStack_e8._0_4_ = 0;
    uStack_e8._4_4_ = 0;
    local_e0 = 0;
    if (local_138->bias_term == 0) {
LAB_003dff82:
      iVar12 = this_00->dilation_w;
      iVar22 = local_130->w;
      iVar2 = this_00->stride_w;
      iVar3 = local_130->h;
      iVar4 = this_00->dilation_h;
      iVar5 = this_00->stride_h;
      iVar6 = this_00->output_pad_right;
      iVar7 = this_00->output_pad_bottom;
      local_198.cstep = 0;
      local_198.data = (void *)0x0;
      local_198.refcount._0_4_ = 0;
      local_198.refcount._4_4_ = 0;
      local_198.elemsize = 0;
      local_198.elempack = 0;
      local_198.allocator = (Allocator *)0x0;
      local_198.dims = 0;
      local_198.w = 0;
      local_198.h = 0;
      local_198.d = 0;
      local_198.c = 0;
      auVar31._0_4_ = -(uint)(0 < this_00->pad_left);
      auVar31._4_4_ = -(uint)(0 < this_00->pad_right);
      auVar31._8_4_ = -(uint)(0 < this_00->pad_top);
      auVar31._12_4_ = -(uint)(0 < this_00->pad_bottom);
      iVar13 = movmskps(kernel_h,auVar31);
      ppAVar14 = local_148;
      if ((iVar13 == 0) && ((this_00->output_w < 1 || (this_00->output_h < 1)))) {
        if (&local_198 != pMVar8) {
          piVar9 = pMVar8->refcount;
          if (piVar9 != (int *)0x0) {
            LOCK();
            *piVar9 = *piVar9 + 1;
            UNLOCK();
          }
          local_198.data = pMVar8->data;
          local_198.refcount._0_4_ = SUB84(pMVar8->refcount,0);
          local_198.refcount._4_4_ = (undefined4)((ulong)pMVar8->refcount >> 0x20);
          local_198.elemsize = pMVar8->elemsize;
          local_198.elempack = pMVar8->elempack;
          local_198.allocator = pMVar8->allocator;
          uVar10 = pMVar8->dims;
          uVar11 = pMVar8->w;
          local_198.h = pMVar8->h;
          local_198.d = pMVar8->d;
          local_198.c = pMVar8->c;
          local_198.cstep = pMVar8->cstep;
          local_198.dims = uVar10;
          local_198.w = uVar11;
        }
        ppAVar14 = &opt->blob_allocator;
      }
      Mat::create(&local_198,iVar6 + (kernel_w + -1) * iVar12 + (iVar22 + -1) * iVar2 + 1,
                  iVar7 + 1 + (kernel_h + -1) * iVar4 + (iVar3 + -1) * iVar5,_c,4,*ppAVar14);
      pMVar8 = local_140;
      if ((local_198.data == (void *)0x0) || ((long)local_198.c * local_198.cstep == 0)) {
LAB_003e01d8:
        iVar22 = -100;
      }
      else {
        deconvolutiondepthwise
                  (local_130,&local_198,&local_c8,(Mat *)local_118,kernel_w,kernel_h,
                   this_00->stride_w,this_00->stride_h,this_00->dilation_w,this_00->dilation_h,
                   this_00->group,this_00->activation_type,&this_00->activation_params,
                   (Option *)0xffffffffffffff9c);
        cut_padding(this_00,&local_198,pMVar8,opt);
        if ((pMVar8->data == (void *)0x0) || (iVar22 = 0, (long)pMVar8->c * pMVar8->cstep == 0))
        goto LAB_003e01d8;
      }
      piVar9 = (int *)CONCAT44(local_198.refcount._4_4_,local_198.refcount._0_4_);
      if (piVar9 != (int *)0x0) {
        LOCK();
        *piVar9 = *piVar9 + -1;
        UNLOCK();
        if (*piVar9 == 0) {
          if (local_198.allocator == (Allocator *)0x0) {
            free(local_198.data);
          }
          else {
            (*(local_198.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      flatten((local_128->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start + 2,(Mat *)local_118,opt);
      iVar22 = -100;
      if (((void *)local_118._0_8_ != (void *)0x0) && ((long)local_e0 * local_d8 != 0))
      goto LAB_003dff82;
    }
    piVar9 = (int *)CONCAT44(local_118._12_4_,local_118._8_4_);
    if (piVar9 != (int *)0x0) {
      LOCK();
      *piVar9 = *piVar9 + -1;
      UNLOCK();
      if (*piVar9 == 0) {
        if (local_f8 == (Allocator *)0x0) {
          free((void *)local_118._0_8_);
        }
        else {
          (*local_f8->_vptr_Allocator[3])();
        }
      }
    }
  }
  piVar9 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        free(local_c8.data);
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
LAB_003e0276:
  piVar9 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
  if (piVar9 != (int *)0x0) {
    LOCK();
    *piVar9 = *piVar9 + -1;
    UNLOCK();
    if (*piVar9 == 0) {
      if (local_78.allocator == (Allocator *)0x0) {
        free(local_78.data);
      }
      else {
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar22;
}

Assistant:

int DeconvolutionDepthWise::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _num_input = bottom_blob.c;
    const int _kernel_w = _weight_data.w;
    const int _kernel_h = _weight_data.h;
    const int _num_output = _weight_data.d * group;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    // transpose group-inch/group-outch/group-kh-kw to group-outch/group-inch/group-kh-kw
    Mat weight_data_transposed;
    {
        weight_data_transposed.create(_kernel_w * _kernel_h * _num_output * _num_input / group, 4u, opt.workspace_allocator);
        if (weight_data_transposed.empty())
            return -100;

        const int outch_g = _num_output / group;
        const int inch_g = _num_input / group;
        const int maxk = _kernel_h * _kernel_w;

        for (int g = 0; g < group; g++)
        {
            // reorder weight from inch-outch to outch-inch
            float* wg2 = (float*)weight_data_transposed + g * outch_g * inch_g * maxk;
            const float* wg = (const float*)weight_data_flattened + g * inch_g * outch_g * maxk;
            for (int i = 0; i < outch_g; i++)
            {
                for (int j = 0; j < inch_g; j++)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        wg2[(i * inch_g + j) * maxk + k] = wg[(j * outch_g + i) * maxk + k];
                    }
                }
            }
        }
    }

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;
    }

    const int w = bottom_blob.w;
    const int h = bottom_blob.h;

    const int kernel_extent_w = dilation_w * (_kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (_kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, _num_output, 4u, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, _num_output, 4u, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolutiondepthwise(bottom_blob, top_blob_bordered, weight_data_transposed, bias_data_flattened, _kernel_w, _kernel_h, stride_w, stride_h, dilation_w, dilation_h, group, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}